

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall RPCCommandExecution::~RPCCommandExecution(RPCCommandExecution *this)

{
  Mutex *in_RDI;
  long in_FS_OFFSET;
  AnnotatedMixin<std::mutex> *unaff_retaddr;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_00000008;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  Mutex *this_00;
  const_iterator in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffeb;
  int in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  char *pszName;
  
  pszName = *(char **)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  MaybeCheckNotHeld(in_RDI);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_00000008,unaff_retaddr,pszName,in_stack_fffffffffffffff0,
             in_stack_ffffffffffffffec,(bool)in_stack_ffffffffffffffeb);
  std::_List_const_iterator<RPCCommandExecutionInfo>::_List_const_iterator
            ((_List_const_iterator<RPCCommandExecutionInfo> *)in_RDI,(iterator *)0x725944);
  std::__cxx11::list<RPCCommandExecutionInfo,_std::allocator<RPCCommandExecutionInfo>_>::erase
            ((list<RPCCommandExecutionInfo,_std::allocator<RPCCommandExecutionInfo>_> *)this_00,
             in_stack_ffffffffffffffe0);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_RDI);
  if (*(char **)(in_FS_OFFSET + 0x28) == pszName) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~RPCCommandExecution()
    {
        LOCK(g_rpc_server_info.mutex);
        g_rpc_server_info.active_commands.erase(it);
    }